

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<1,_460>::DiscretePhotons::DiscretePhotons
          (DiscretePhotons *this,
          vector<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
          *multiplicities)

{
  pointer pDVar1;
  
  pDVar1 = (multiplicities->
           super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->photons_).
  super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (multiplicities->
       super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->photons_).
  super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar1;
  (this->photons_).
  super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (multiplicities->
       super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (multiplicities->
  super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (multiplicities->
  super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (multiplicities->
  super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verifySize((int)(((long)(this->photons_).
                          super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->photons_).
                         super__Vector_base<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<1,_460>::DiscretePhotonMultiplicity>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x90));
  return;
}

Assistant:

DiscretePhotons( std::vector< DiscretePhotonMultiplicity >&& multiplicities )
  try : photons_( std::move( multiplicities ) ) {

    verifySize( this->NG() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing discrete photon data" );
    throw;
  }